

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

void sznet::net::sockets::sz_bindordie(sz_sock sockfd,sockaddr *addr)

{
  int iVar1;
  SourceFile file;
  Logger local_ff0;
  undefined1 local_20 [12];
  
  iVar1 = bind(sockfd,(sockaddr *)addr,0x10);
  if (iVar1 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_20,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_20._0_8_;
    file.m_size = local_20._8_4_;
    Logger::Logger(&local_ff0,file,0x101,true);
    LogStream::operator<<(&local_ff0.m_impl.m_stream,"sockets::sz_bindordie");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void sz_bindordie(sz_sock sockfd, const struct sockaddr* addr)
{
	int ret = ::bind(sockfd, addr, static_cast<socklen_t>(sizeof(struct sockaddr)));
	if (ret < 0)
	{
		LOG_SYSFATAL << "sockets::sz_bindordie";
	}
}